

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_anchor(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  undefined2 uVar1;
  bool bVar2;
  MOB_INDEX_DATA *pMobIndex;
  CHAR_DATA *pCVar3;
  CHAR_DATA *ch_00;
  
  uVar1 = ch->in_room->sector_type;
  if (((ushort)(uVar1 - 7) < 2) || ((ch->in_room->room_flags[0] & 0x2000) != 0)) {
    send_to_char("You cannot create an anchor here.\n\r",ch);
    return;
  }
  pCVar3 = char_list;
  do {
    ch_00 = pCVar3;
    if (ch_00 == (CHAR_DATA *)0x0) {
      ch_00 = (CHAR_DATA *)0x0;
      break;
    }
    pCVar3 = ch_00->next;
    bVar2 = is_npc(ch_00);
  } while (((!bVar2) || (ch_00->pIndexData->vnum != 0xb8e)) || (ch_00->hunting != ch));
  if (ch_00 != (CHAR_DATA *)0x0) {
    act("$n dissipates harmlessly.",ch_00,(void *)0x0,(void *)0x0,0);
    extract_char(ch_00,true);
  }
  pMobIndex = get_mob_index(0);
  pCVar3 = create_mobile(pMobIndex);
  char_to_room(pCVar3,ch->in_room);
  pCVar3->level = (short)level;
  pCVar3->hunting = ch;
  act("You harness the energy in the surrounding air to anchor your essence to this spot.",ch,
      (void *)0x0,(void *)0x0,3);
  act("$n concentrates intently, and a small funnel cloud begins to spin in place beside $m.",ch,
      (void *)0x0,(void *)0x0,0);
  return;
}

Assistant:

void spell_anchor(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *anchor, *wch, *wch_next, *oldanchor = nullptr;

	if (ch->in_room->sector_type == SECT_INSIDE
		|| ch->in_room->sector_type == SECT_UNDERWATER
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL))
	{
		send_to_char("You cannot create an anchor here.\n\r", ch);
		return;
	}

	for (wch = char_list; wch != nullptr; wch = wch_next)
	{
		wch_next = wch->next;

		if (is_npc(wch) && wch->pIndexData->vnum == MOB_VNUM_ANCHOR && wch->hunting == ch)
		{
			oldanchor = wch;
			break;
		}
	}

	if (oldanchor)
	{
		act("$n dissipates harmlessly.", oldanchor, 0, 0, TO_ROOM);
		extract_char(oldanchor, true);
	}

	anchor = create_mobile(get_mob_index(MOB_VNUM_ANCHOR));
	char_to_room(anchor, ch->in_room);
	anchor->level = level;
	anchor->hunting = ch;

	act("You harness the energy in the surrounding air to anchor your essence to this spot.", ch, 0, 0, TO_CHAR);
	act("$n concentrates intently, and a small funnel cloud begins to spin in place beside $m.", ch, 0, 0, TO_ROOM);
}